

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

int Cof_ObjLevel(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  Gia_Man_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj_00;
  Cof_Obj_t *pObj_local;
  Cof_Man_t *p_local;
  
  p_00 = p->pGia;
  pObj_00 = Gia_ManObj(p->pGia,pObj->Id);
  iVar1 = Gia_ObjLevel(p_00,pObj_00);
  return iVar1;
}

Assistant:

static inline int         Cof_ObjLevel( Cof_Man_t * p, Cof_Obj_t * pObj )             { return Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia,pObj->Id)); }